

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::LinTerms>
               (JSONW *jw,LinTerms *qt)

{
  string_view key;
  string_view key_00;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> MStack_48;
  ArrayRef<double> local_38;
  
  local_38.data_ =
       (qt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  local_38.size_ =
       (qt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  key._M_str = (char *)0x5;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&MStack_48,key);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
             &local_38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&MStack_48);
  if (local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  local_38.data_ =
       (double *)
       (qt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_38.size_ =
       (qt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  key_00._M_str = (char *)0x4;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&MStack_48,key_00);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&MStack_48,
             (ArrayRef<int> *)&local_38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&MStack_48);
  if (local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteJSON(JSONW jw, const LinTerms& qt) {
  jw["coefs"] = qt.coefs();
  jw["vars"] = qt.vars();
}